

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void co_yield_ct(void)

{
  stCoRoutineEnv_t *env;
  
  env = co_get_curr_thread_env();
  co_yield_env(env);
  return;
}

Assistant:

void co_yield_ct()
{

	co_yield_env( co_get_curr_thread_env() );
}